

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O0

TIntermTyped * __thiscall
glslang::TIntermediate::addBuiltInFunctionCall
          (TIntermediate *this,TSourceLoc *loc,TOperator op,bool unary,TIntermNode *childNode,
          TType *returnType)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TIntermTyped *pTVar2;
  undefined4 extraout_var_02;
  TIntermTyped *node;
  TIntermTyped *folded;
  TIntermTyped *child;
  TType *returnType_local;
  TIntermNode *childNode_local;
  bool unary_local;
  TOperator op_local;
  TSourceLoc *loc_local;
  TIntermediate *this_local;
  TIntermTyped *child_00;
  
  if (unary) {
    iVar1 = (*childNode->_vptr_TIntermNode[3])();
    child_00 = (TIntermTyped *)CONCAT44(extraout_var,iVar1);
    if (child_00 == (TIntermTyped *)0x0) {
      this_local = (TIntermediate *)0x0;
    }
    else {
      iVar1 = (*(child_00->super_TIntermNode)._vptr_TIntermNode[5])();
      if (CONCAT44(extraout_var_00,iVar1) != 0) {
        iVar1 = (*(child_00->super_TIntermNode)._vptr_TIntermNode[5])();
        pTVar2 = (TIntermTyped *)
                 (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar1) + 0x188))
                           ((long *)CONCAT44(extraout_var_01,iVar1),op,returnType);
        if (pTVar2 != (TIntermTyped *)0x0) {
          return pTVar2;
        }
      }
      iVar1 = (**(child_00->super_TIntermNode)._vptr_TIntermNode)();
      this_local = (TIntermediate *)
                   addUnaryNode(this,op,child_00,(TSourceLoc *)CONCAT44(extraout_var_02,iVar1),
                                returnType);
    }
  }
  else {
    this_local = (TIntermediate *)setAggregateOperator(this,childNode,op,returnType,loc);
  }
  return (TIntermTyped *)this_local;
}

Assistant:

TIntermTyped* TIntermediate::addBuiltInFunctionCall(const TSourceLoc& loc, TOperator op, bool unary,
    TIntermNode* childNode, const TType& returnType)
{
    if (unary) {
        //
        // Treat it like a unary operator.
        // addUnaryMath() should get the type correct on its own;
        // including constness (which would differ from the prototype).
        //
        TIntermTyped* child = childNode->getAsTyped();
        if (child == nullptr)
            return nullptr;

        if (child->getAsConstantUnion()) {
            TIntermTyped* folded = child->getAsConstantUnion()->fold(op, returnType);
            if (folded)
                return folded;
        }

        return addUnaryNode(op, child, child->getLoc(), returnType);
    } else {
        // setAggregateOperater() calls fold() for constant folding
        TIntermTyped* node = setAggregateOperator(childNode, op, returnType, loc);

        return node;
    }
}